

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O3

aom_codec_err_t
ctrl_set_target_seq_level_idx(aom_codec_alg_priv_t_conflict *ctx,__va_list_tag *args)

{
  int iVar1;
  aom_codec_err_t aVar2;
  int *piVar3;
  uint uVar4;
  char *__s;
  av1_extracfg extra_cfg;
  av1_extracfg aStack_268;
  
  memcpy(&aStack_268,&ctx->extra_cfg,600);
  uVar4 = args->gp_offset;
  if ((ulong)uVar4 < 0x29) {
    piVar3 = (int *)((ulong)uVar4 + (long)args->reg_save_area);
    args->gp_offset = uVar4 + 8;
  }
  else {
    piVar3 = (int *)args->overflow_arg_area;
    args->overflow_arg_area = piVar3 + 2;
  }
  iVar1 = *piVar3;
  if (iVar1 - 0xc80U < 0xfffff31d) {
    __s = (ctx->ppi->error).detail;
    snprintf(__s,200,"Invalid operating point index: %d");
    (ctx->base).err_detail = __s;
    aVar2 = AOM_CODEC_INVALID_PARAM;
  }
  else {
    uVar4 = (short)iVar1 * 0x147b;
    aStack_268.target_seq_level_idx[(uint)(iVar1 / 100)] =
         (char)iVar1 + ((char)(uVar4 >> 0x13) - (char)((int)uVar4 >> 0x1f)) * -100;
    aVar2 = update_extra_cfg(ctx,&aStack_268);
  }
  return aVar2;
}

Assistant:

static aom_codec_err_t ctrl_set_target_seq_level_idx(aom_codec_alg_priv_t *ctx,
                                                     va_list args) {
  struct av1_extracfg extra_cfg = ctx->extra_cfg;
  const int val = CAST(AV1E_SET_TARGET_SEQ_LEVEL_IDX, args);
  const int level = val % 100;
  const int operating_point_idx = val / 100;
  if (operating_point_idx < 0 ||
      operating_point_idx >= MAX_NUM_OPERATING_POINTS) {
    char *const err_string = ctx->ppi->error.detail;
    snprintf(err_string, ARG_ERR_MSG_MAX_LEN,
             "Invalid operating point index: %d", operating_point_idx);
    ctx->base.err_detail = err_string;
    return AOM_CODEC_INVALID_PARAM;
  }
  extra_cfg.target_seq_level_idx[operating_point_idx] = (AV1_LEVEL)level;
  return update_extra_cfg(ctx, &extra_cfg);
}